

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t
zesGetFrequencyProcAddrTable(ze_api_version_t version,zes_frequency_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t zVar2;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (zes_frequency_dditable_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(zes_pfnFrequencyGetProperties_t *)(validation_layer::context + 0x2b8) =
           pDdiTable->pfnGetProperties;
      pDdiTable->pfnGetProperties = validation_layer::zesFrequencyGetProperties;
      *(zes_pfnFrequencyGetAvailableClocks_t *)(pzVar1 + 0x2ba) = pDdiTable->pfnGetAvailableClocks;
      pDdiTable->pfnGetAvailableClocks = validation_layer::zesFrequencyGetAvailableClocks;
      *(zes_pfnFrequencyGetRange_t *)(pzVar1 + 700) = pDdiTable->pfnGetRange;
      pDdiTable->pfnGetRange = validation_layer::zesFrequencyGetRange;
      *(zes_pfnFrequencySetRange_t *)(pzVar1 + 0x2be) = pDdiTable->pfnSetRange;
      pDdiTable->pfnSetRange = validation_layer::zesFrequencySetRange;
      *(zes_pfnFrequencyGetState_t *)(pzVar1 + 0x2c0) = pDdiTable->pfnGetState;
      pDdiTable->pfnGetState = validation_layer::zesFrequencyGetState;
      *(zes_pfnFrequencyGetThrottleTime_t *)(pzVar1 + 0x2c2) = pDdiTable->pfnGetThrottleTime;
      pDdiTable->pfnGetThrottleTime = validation_layer::zesFrequencyGetThrottleTime;
      *(zes_pfnFrequencyOcGetCapabilities_t *)(pzVar1 + 0x2c4) = pDdiTable->pfnOcGetCapabilities;
      pDdiTable->pfnOcGetCapabilities = validation_layer::zesFrequencyOcGetCapabilities;
      *(zes_pfnFrequencyOcGetFrequencyTarget_t *)(pzVar1 + 0x2c6) =
           pDdiTable->pfnOcGetFrequencyTarget;
      pDdiTable->pfnOcGetFrequencyTarget = validation_layer::zesFrequencyOcGetFrequencyTarget;
      *(zes_pfnFrequencyOcSetFrequencyTarget_t *)(pzVar1 + 0x2c8) =
           pDdiTable->pfnOcSetFrequencyTarget;
      pDdiTable->pfnOcSetFrequencyTarget = validation_layer::zesFrequencyOcSetFrequencyTarget;
      *(zes_pfnFrequencyOcGetVoltageTarget_t *)(pzVar1 + 0x2ca) = pDdiTable->pfnOcGetVoltageTarget;
      pDdiTable->pfnOcGetVoltageTarget = validation_layer::zesFrequencyOcGetVoltageTarget;
      *(zes_pfnFrequencyOcSetVoltageTarget_t *)(pzVar1 + 0x2cc) = pDdiTable->pfnOcSetVoltageTarget;
      pDdiTable->pfnOcSetVoltageTarget = validation_layer::zesFrequencyOcSetVoltageTarget;
      *(zes_pfnFrequencyOcSetMode_t *)(pzVar1 + 0x2ce) = pDdiTable->pfnOcSetMode;
      pDdiTable->pfnOcSetMode = validation_layer::zesFrequencyOcSetMode;
      *(zes_pfnFrequencyOcGetMode_t *)(pzVar1 + 0x2d0) = pDdiTable->pfnOcGetMode;
      pDdiTable->pfnOcGetMode = validation_layer::zesFrequencyOcGetMode;
      *(zes_pfnFrequencyOcGetIccMax_t *)(pzVar1 + 0x2d2) = pDdiTable->pfnOcGetIccMax;
      pDdiTable->pfnOcGetIccMax = validation_layer::zesFrequencyOcGetIccMax;
      *(zes_pfnFrequencyOcSetIccMax_t *)(pzVar1 + 0x2d4) = pDdiTable->pfnOcSetIccMax;
      pDdiTable->pfnOcSetIccMax = validation_layer::zesFrequencyOcSetIccMax;
      *(zes_pfnFrequencyOcGetTjMax_t *)(pzVar1 + 0x2d6) = pDdiTable->pfnOcGetTjMax;
      pDdiTable->pfnOcGetTjMax = validation_layer::zesFrequencyOcGetTjMax;
      *(zes_pfnFrequencyOcSetTjMax_t *)(pzVar1 + 0x2d8) = pDdiTable->pfnOcSetTjMax;
      pDdiTable->pfnOcSetTjMax = validation_layer::zesFrequencyOcSetTjMax;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetFrequencyProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_frequency_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Frequency;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesFrequencyGetProperties;

    dditable.pfnGetAvailableClocks                       = pDdiTable->pfnGetAvailableClocks;
    pDdiTable->pfnGetAvailableClocks                     = validation_layer::zesFrequencyGetAvailableClocks;

    dditable.pfnGetRange                                 = pDdiTable->pfnGetRange;
    pDdiTable->pfnGetRange                               = validation_layer::zesFrequencyGetRange;

    dditable.pfnSetRange                                 = pDdiTable->pfnSetRange;
    pDdiTable->pfnSetRange                               = validation_layer::zesFrequencySetRange;

    dditable.pfnGetState                                 = pDdiTable->pfnGetState;
    pDdiTable->pfnGetState                               = validation_layer::zesFrequencyGetState;

    dditable.pfnGetThrottleTime                          = pDdiTable->pfnGetThrottleTime;
    pDdiTable->pfnGetThrottleTime                        = validation_layer::zesFrequencyGetThrottleTime;

    dditable.pfnOcGetCapabilities                        = pDdiTable->pfnOcGetCapabilities;
    pDdiTable->pfnOcGetCapabilities                      = validation_layer::zesFrequencyOcGetCapabilities;

    dditable.pfnOcGetFrequencyTarget                     = pDdiTable->pfnOcGetFrequencyTarget;
    pDdiTable->pfnOcGetFrequencyTarget                   = validation_layer::zesFrequencyOcGetFrequencyTarget;

    dditable.pfnOcSetFrequencyTarget                     = pDdiTable->pfnOcSetFrequencyTarget;
    pDdiTable->pfnOcSetFrequencyTarget                   = validation_layer::zesFrequencyOcSetFrequencyTarget;

    dditable.pfnOcGetVoltageTarget                       = pDdiTable->pfnOcGetVoltageTarget;
    pDdiTable->pfnOcGetVoltageTarget                     = validation_layer::zesFrequencyOcGetVoltageTarget;

    dditable.pfnOcSetVoltageTarget                       = pDdiTable->pfnOcSetVoltageTarget;
    pDdiTable->pfnOcSetVoltageTarget                     = validation_layer::zesFrequencyOcSetVoltageTarget;

    dditable.pfnOcSetMode                                = pDdiTable->pfnOcSetMode;
    pDdiTable->pfnOcSetMode                              = validation_layer::zesFrequencyOcSetMode;

    dditable.pfnOcGetMode                                = pDdiTable->pfnOcGetMode;
    pDdiTable->pfnOcGetMode                              = validation_layer::zesFrequencyOcGetMode;

    dditable.pfnOcGetIccMax                              = pDdiTable->pfnOcGetIccMax;
    pDdiTable->pfnOcGetIccMax                            = validation_layer::zesFrequencyOcGetIccMax;

    dditable.pfnOcSetIccMax                              = pDdiTable->pfnOcSetIccMax;
    pDdiTable->pfnOcSetIccMax                            = validation_layer::zesFrequencyOcSetIccMax;

    dditable.pfnOcGetTjMax                               = pDdiTable->pfnOcGetTjMax;
    pDdiTable->pfnOcGetTjMax                             = validation_layer::zesFrequencyOcGetTjMax;

    dditable.pfnOcSetTjMax                               = pDdiTable->pfnOcSetTjMax;
    pDdiTable->pfnOcSetTjMax                             = validation_layer::zesFrequencyOcSetTjMax;

    return result;
}